

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkUtil.c
# Opt level: O0

void Nwk_ManMinimumBaseRec(Nwk_Man_t *pNtk,int fVerbose)

{
  int iVar1;
  abctime aVar2;
  abctime aVar3;
  abctime clk;
  int i;
  int fVerbose_local;
  Nwk_Man_t *pNtk_local;
  
  aVar2 = Abc_Clock();
  do {
    iVar1 = Nwk_ManMinimumBaseInt(pNtk,fVerbose);
  } while (iVar1 != 0);
  Abc_Print(1,"%s =","Minbase");
  aVar3 = Abc_Clock();
  Abc_Print(1,"%9.2f sec\n",((double)(aVar3 - aVar2) * 1.0) / 1000000.0);
  return;
}

Assistant:

void Nwk_ManMinimumBaseRec( Nwk_Man_t * pNtk, int fVerbose )
{
    int i;
    abctime clk = Abc_Clock();
    for ( i = 0; Nwk_ManMinimumBaseInt( pNtk, fVerbose ); i++ );
    ABC_PRT( "Minbase", Abc_Clock() - clk );
}